

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O3

json_value * json_parse_ex(json_settings *settings,char *json,size_t length,char *error_buf)

{
  double dVar1;
  ushort uVar2;
  bool bVar3;
  uchar uVar4;
  byte bVar5;
  uchar uVar6;
  byte bVar7;
  byte bVar8;
  ushort **ppuVar9;
  long lVar10;
  anon_union_8_2_291a86ad_for__reserved *paVar11;
  int iVar12;
  char *pcVar13;
  uint uVar14;
  _json_value *p_Var15;
  uint uVar16;
  json_value *pjVar17;
  json_type jVar18;
  ulong uVar19;
  byte *pbVar20;
  ulong uVar21;
  uint uVar22;
  byte bVar23;
  long in_FS_OFFSET;
  json_value *root;
  char error [128];
  _json_value *local_188;
  long local_178;
  long local_168;
  long local_160;
  json_state local_138;
  json_value *local_d0;
  json_value *local_c8;
  json_value *local_c0;
  ulong local_b8;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  undefined2 uStack_a8;
  char acStack_a6 [110];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((2 < length) && (*json == -0x11)) && (json[1] == -0x45)) && (json[2] == -0x41)) {
    json = json + 3;
    length = length - 3;
  }
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_138.settings.max_memory = settings->max_memory;
  local_138.settings._8_8_ = *(undefined8 *)&settings->settings;
  local_138.settings.mem_alloc = settings->mem_alloc;
  local_138.settings.mem_free = settings->mem_free;
  local_138.settings.user_data = settings->user_data;
  local_138.settings.value_extra = settings->value_extra;
  if (local_138.settings.mem_alloc == (_func_void_ptr_size_t_int_void_ptr *)0x0) {
    local_138.settings.mem_alloc = default_alloc;
  }
  pbVar20 = (byte *)json + length;
  if (local_138.settings.mem_free == (_func_void_void_ptr_void_ptr *)0x0) {
    local_138.settings.mem_free = default_free;
  }
  local_d0 = (json_value *)0x0;
  local_138.first_pass = 1;
  local_138._76_4_ = 0;
  local_138.ulong_max = 0xfffffffffffffff7;
  local_138.uint_max = 0xfffffff7;
  local_138._12_4_ = 0;
  local_138.used_memory = 0;
  local_160 = 0;
  local_168 = 0;
  local_178 = 0;
  local_c8 = (json_value *)0x0;
  local_c0 = (json_value *)0x0;
  local_138.cur_line = 1;
  local_138.cur_col = 0;
  uVar22 = 8;
  bVar3 = false;
  local_188 = (_json_value *)0x0;
  uVar21 = 0;
LAB_001ac893:
  pjVar17 = local_c0;
  uVar16 = (uint)uVar21;
  local_138.ptr = json;
  if ((byte *)json == pbVar20) {
    if ((uVar22 & 0x20) != 0) {
LAB_001ad7b7:
      uVar19 = local_138._88_8_ & 0xffffffff;
      uVar21 = (ulong)local_138.cur_col;
      pcVar13 = "Unexpected EOF in string (at %d:%d)";
      goto LAB_001ad7e7;
    }
    uVar14 = 0;
LAB_001ac8f0:
    bVar5 = (byte)uVar14;
    if ((local_138.settings._8_8_ & 1) == 0) {
code_r0x001ac907:
      if ((uVar22 & 8) == 0) {
        jVar18 = local_c0->type;
        if (jVar18 - json_integer < 2) {
          ppuVar9 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar9 + (long)(char)bVar5 * 2 + 1) & 8) == 0) {
            if (bVar5 == 0x2b) {
LAB_001ac966:
              if ((uVar22 & 0xc00) != 0x400) {
LAB_001acff3:
                if ((uVar22 >> 10 & 1) != 0) goto LAB_001ad221;
                if (jVar18 == json_double) goto LAB_001ad18a;
LAB_001ad1db:
                if ((bVar5 & 0xdf) == 0x45) {
                  if (pjVar17->type == json_integer) {
                    pjVar17->type = json_double;
                    (pjVar17->u).dbl = (double)(pjVar17->u).integer;
                  }
                  uVar22 = uVar22 & 0xfffff977 | 0x400;
                  goto LAB_001ad213;
                }
LAB_001ad26a:
                if ((uVar22 >> 8 & 1) != 0) {
                  if (pjVar17->type == json_integer) {
                    (pjVar17->u).integer = -(pjVar17->u).integer;
                  }
                  else {
                    (pjVar17->u).integer = (pjVar17->u).integer ^ 0x8000000000000000;
                  }
                }
                bVar3 = true;
                uVar16 = uVar22 | 3;
                goto LAB_001ad296;
              }
              uVar22 = (uint)(bVar5 == 0x2d) << 0xc | uVar22 | 0x800;
            }
            else {
              if (uVar14 != 0x2e) {
                if (uVar14 == 0x2d) goto LAB_001ac966;
                goto LAB_001acff3;
              }
              if (jVar18 != json_integer) {
                if ((uVar22 >> 10 & 1) == 0) {
LAB_001ad18a:
                  if (local_178 != 0) {
                    dVar1 = pow(10.0,(double)local_178);
                    (pjVar17->u).dbl = (double)local_160 / dVar1 + (pjVar17->u).dbl;
                    goto LAB_001ad1db;
                  }
                  uVar19 = local_138._88_8_ & 0xffffffff;
                  uVar21 = (ulong)local_138.cur_col;
                  pcVar13 = "%d:%d: Expected digit after `.`";
                }
                else {
LAB_001ad221:
                  if (local_178 != 0) {
                    lVar10 = -local_168;
                    if ((uVar22 >> 0xc & 1) == 0) {
                      lVar10 = local_168;
                    }
                    dVar1 = pow(10.0,(double)lVar10);
                    (pjVar17->u).dbl = dVar1 * (pjVar17->u).dbl;
                    goto LAB_001ad26a;
                  }
                  uVar19 = local_138._88_8_ & 0xffffffff;
                  uVar21 = (ulong)local_138.cur_col;
                  pcVar13 = "%d:%d: Expected digit after `e`";
                }
                goto LAB_001ad7e7;
              }
              if (local_178 == 0) {
                uVar19 = local_138._88_8_ & 0xffffffff;
                uVar21 = (ulong)local_138.cur_col;
                pcVar13 = "%d:%d: Expected digit before `.`";
                goto LAB_001ad7e7;
              }
              pjVar17->type = json_double;
              (pjVar17->u).dbl = (double)(pjVar17->u).integer;
LAB_001ad213:
              local_178 = 0;
            }
          }
          else {
            iVar12 = (int)(char)bVar5;
            lVar10 = local_178 + 1;
            if ((jVar18 == json_integer) || ((uVar22 & 0x400) != 0)) {
              if ((uVar22 >> 10 & 1) == 0) {
                if ((uVar22 >> 9 & 1) != 0) {
                  uVar19 = local_138._88_8_ & 0xffffffff;
                  uVar21 = (ulong)local_138.cur_col;
                  pcVar13 = "%d:%d: Unexpected `0` before `%c`";
                  goto LAB_001ad7e7;
                }
                uVar16 = uVar22 | 0x200;
                if (bVar5 != 0x30) {
                  uVar16 = uVar22;
                }
                if (local_178 == 0) {
                  uVar22 = uVar16;
                }
                (pjVar17->u).integer = (long)iVar12 + (pjVar17->u).integer * 10 + -0x30;
                local_178 = lVar10;
              }
              else {
                uVar22 = uVar22 | 0x800;
                local_168 = (long)iVar12 + local_168 * 10 + -0x30;
                local_178 = lVar10;
              }
            }
            else {
              local_160 = (long)iVar12 + local_160 * 10 + -0x30;
              local_178 = lVar10;
            }
          }
        }
        else {
          uVar16 = uVar22;
          if (jVar18 == json_object) {
            if (uVar14 < 0x20) {
              if (uVar14 == 9) goto LAB_001ad068;
              if (uVar14 == 10) goto LAB_001acbd5;
              if (uVar14 != 0xd) goto LAB_001ada19;
              goto LAB_001ad068;
            }
            if (uVar14 < 0x2c) {
              if (uVar14 == 0x20) goto LAB_001ad068;
              if (uVar14 != 0x22) {
LAB_001ada19:
                uVar19 = local_138._88_8_ & 0xffffffff;
                uVar21 = (ulong)local_138.cur_col;
                pcVar13 = "%d:%d: Unexpected `%c` in object";
LAB_001ad7e7:
                __sprintf_chk(&local_b8,1,0x80,pcVar13,uVar19,uVar21);
LAB_001ad800:
                if (error_buf != (char *)0x0) {
                  if ((char)local_b8 == '\0') {
                    builtin_strncpy(error_buf,"Unknown error",0xe);
                  }
                  else {
                    strcpy(error_buf,(char *)&local_b8);
                  }
                }
                if (local_138.first_pass != 0) {
                  local_d0 = local_c8;
                }
                pjVar17 = local_d0;
                if (local_d0 != (json_value *)0x0) {
                  do {
                    p_Var15 = (pjVar17->_reserved).next_alloc;
                    (*local_138.settings.mem_free)(pjVar17,local_138.settings.user_data);
                    pjVar17 = p_Var15;
                  } while (p_Var15 != (_json_value *)0x0);
                }
                if (local_138.first_pass == 0) {
                  json_value_free_ex(&local_138.settings,local_c8);
                }
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  return (json_value *)0x0;
                }
                __stack_chk_fail();
              }
              if ((uVar22 & 4) != 0) {
                uVar19 = local_138._88_8_ & 0xffffffff;
                uVar21 = (ulong)local_138.cur_col;
                pcVar13 = "%d:%d: Expected , before \"";
                goto LAB_001ad7e7;
              }
              uVar16 = uVar22 | 0x20;
              local_188 = (local_c0->_reserved).next_alloc;
              uVar21 = 0;
            }
            else {
              if (uVar14 != 0x2c) {
                if (uVar14 == 0x7d) goto LAB_001acad4;
                goto LAB_001ada19;
              }
              if ((uVar22 & 4) == 0) goto LAB_001ada19;
              uVar16 = uVar22 & 0xffffff73;
            }
          }
LAB_001ad296:
          uVar22 = uVar16;
          if ((uVar16 & 2) != 0) {
            uVar22 = uVar16 & 0xfffffffd;
            local_138.ptr = local_138.ptr + -1;
          }
          if (bVar3) {
            p_Var15 = local_c0->parent;
            if (p_Var15 == (_json_value *)0x0) {
              uVar22 = uVar22 & 0xfffffffa | 0x84;
              bVar3 = false;
            }
            else {
              jVar18 = p_Var15->type;
              if (local_138.first_pass == 0) {
                if (jVar18 == json_array) {
                  *(json_value **)((p_Var15->u).string.ptr + (ulong)(p_Var15->u).string.length * 8)
                       = local_c0;
                  p_Var15 = local_c0->parent;
                }
                else if (jVar18 == json_object) {
                  (p_Var15->u).object.values[(p_Var15->u).string.length].value = local_c0;
                }
              }
              uVar16 = (p_Var15->u).boolean + 1;
              (p_Var15->u).string.length = uVar16;
              if (local_138.uint_max < uVar16) goto LAB_001ad7d0;
              uVar22 = (uint)(jVar18 == json_array) << 3 | uVar22 & 0xfffffffa | 4;
              bVar3 = false;
              local_c0 = local_c0->parent;
            }
          }
        }
      }
      else if (uVar14 < 0xd) {
        if (uVar14 != 9) {
          if (uVar14 != 10) goto LAB_001ace99;
LAB_001acbd5:
          local_138.cur_col = 0;
          local_138.cur_line = local_138.cur_line + 1;
        }
      }
      else if ((uVar14 != 0xd) && (uVar14 != 0x20)) {
        if (uVar14 == 0x5d) {
          if ((local_c0 != (json_value *)0x0) && (local_c0->type == json_array)) {
LAB_001acad4:
            uVar16 = (uVar22 & 0xffffff72) + 1;
            bVar3 = true;
            goto LAB_001ad296;
          }
          uVar19 = local_138._88_8_ & 0xffffffff;
          uVar21 = (ulong)local_138.cur_col;
          pcVar13 = "%d:%d: Unexpected ]";
          goto LAB_001ad7e7;
        }
LAB_001ace99:
        if ((uVar22 & 4) == 0) {
          if ((uVar22 & 0x40) == 0) {
            uVar16 = uVar22 & 0xffffff33;
            if (uVar14 < 0x6e) {
              if (uVar14 == 0x22) {
                iVar12 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_string);
                if (iVar12 != 0) {
                  uVar22 = uVar16 | 0x20;
                  local_188 = (_json_value *)(local_c0->u).object.values;
                  uVar21 = 0;
                  goto LAB_001ad068;
                }
              }
              else if (uVar14 == 0x5b) {
                iVar12 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_array);
LAB_001ad64b:
                if (iVar12 != 0) goto LAB_001ad068;
              }
              else {
                if (uVar14 == 0x66) {
                  if ((((long)pbVar20 - (long)json < 4) ||
                      (local_138.ptr = (char *)((byte *)json + 1), ((byte *)json)[1] != 0x61)) ||
                     ((local_138.ptr = (char *)((byte *)json + 2), ((byte *)json)[2] != 0x6c ||
                      ((local_138.ptr = (char *)((byte *)json + 3), ((byte *)json)[3] != 0x73 ||
                       (local_138.ptr = (char *)((byte *)json + 4), ((byte *)json)[4] != 0x65))))))
                  goto LAB_001ad9fd;
                  jVar18 = json_boolean;
                  goto LAB_001ad55c;
                }
LAB_001ad579:
                ppuVar9 = __ctype_b_loc();
                if (((*(byte *)((long)*ppuVar9 + (long)(char)bVar5 * 2 + 1) & 8) == 0) &&
                   (bVar5 != 0x2d)) {
                  uVar19 = local_138._88_8_ & 0xffffffff;
                  uVar21 = (ulong)local_138._88_8_ >> 0x20;
                  pcVar13 = "%d:%d: Unexpected %c when seeking value";
                  goto LAB_001ad7e7;
                }
                iVar12 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_integer);
                if (iVar12 != 0) {
                  if (local_138.first_pass == 0) {
                    while (((((*ppuVar9)[(char)uVar14] >> 0xb & 1) != 0 ||
                            ((uVar14 - 0x2b < 0x3b &&
                             ((0x40000000400000dU >> ((ulong)(uVar14 - 0x2b) & 0x3f) & 1) != 0))))
                           && (local_138.ptr = local_138.ptr + 1, (byte *)local_138.ptr != pbVar20))
                          ) {
                      uVar14 = (uint)(byte)*local_138.ptr;
                    }
                    uVar16 = uVar16 | 3;
                    bVar3 = true;
                  }
                  else {
                    if (bVar5 == 0x2d) {
                      uVar22 = uVar22 & 0xffffe033 | 0x100;
                      local_178 = 0;
                      local_168 = 0;
                      local_160 = 0;
                      goto LAB_001ad068;
                    }
                    uVar16 = uVar22 & 0xffffe033 | 2;
                    local_178 = 0;
                    local_168 = 0;
                    local_160 = 0;
                  }
                  goto LAB_001ad296;
                }
              }
LAB_001adab4:
              acStack_a6[0] = 'f';
              acStack_a6[1] = 'a';
              acStack_a6[2] = 'i';
              acStack_a6[3] = 'l';
              acStack_a6[4] = 'u';
              acStack_a6[5] = 'r';
              acStack_a6[6] = 'e';
              acStack_a6[7] = '\0';
              uStack_a8 = 0x206e;
              local_b8._0_1_ = 'M';
              local_b8._1_1_ = 'e';
              local_b8._2_1_ = 'm';
              local_b8._3_1_ = 'o';
              local_b8._4_1_ = 'r';
              local_b8._5_1_ = 'y';
              local_b8._6_1_ = ' ';
              local_b8._7_1_ = 'a';
              uStack_b0 = 0x6c6c;
              uStack_ae = 0x6f697461636f;
              goto LAB_001ad800;
            }
            if (uVar14 == 0x6e) {
              if (((((long)pbVar20 - (long)json < 3) ||
                   (local_138.ptr = (char *)((byte *)json + 1), ((byte *)json)[1] != 0x75)) ||
                  (local_138.ptr = (char *)((byte *)json + 2), ((byte *)json)[2] != 0x6c)) ||
                 (local_138.ptr = (char *)((byte *)json + 3), ((byte *)json)[3] != 0x6c)) {
LAB_001ad9fd:
                uVar19 = local_138._88_8_ & 0xffffffff;
                uVar21 = (ulong)local_138.cur_col;
                pcVar13 = "%d:%d: Unknown value";
                goto LAB_001ad7e7;
              }
              jVar18 = json_null;
LAB_001ad55c:
              iVar12 = new_value(&local_138,&local_c0,&local_c8,&local_d0,jVar18);
              if (iVar12 == 0) goto LAB_001adab4;
            }
            else {
              if (uVar14 != 0x74) {
                if (uVar14 != 0x7b) goto LAB_001ad579;
                iVar12 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_object);
                uVar22 = uVar16;
                goto LAB_001ad64b;
              }
              if ((((long)pbVar20 - (long)json < 3) ||
                  (local_138.ptr = (char *)((byte *)json + 1), ((byte *)json)[1] != 0x72)) ||
                 ((local_138.ptr = (char *)((byte *)json + 2), ((byte *)json)[2] != 0x75 ||
                  (local_138.ptr = (char *)((byte *)json + 3), ((byte *)json)[3] != 0x65))))
              goto LAB_001ad9fd;
              iVar12 = new_value(&local_138,&local_c0,&local_c8,&local_d0,json_boolean);
              if (iVar12 == 0) goto LAB_001adab4;
              (local_c0->u).boolean = 1;
            }
            bVar3 = true;
            goto LAB_001ad296;
          }
          if (bVar5 != 0x3a) {
            uVar19 = local_138._88_8_ & 0xffffffff;
            uVar21 = (ulong)local_138.cur_col;
            pcVar13 = "%d:%d: Expected : before %c";
            goto LAB_001ad7e7;
          }
          uVar22 = uVar22 & 0xffffff3b;
        }
        else {
          if (bVar5 != 0x2c) {
            uVar19 = local_138._88_8_ & 0xffffffff;
            uVar21 = (ulong)local_138.cur_col;
            pcVar13 = "%d:%d: Expected , before %c";
            goto LAB_001ad7e7;
          }
          uVar22 = uVar22 & 0xffffff7b;
        }
      }
    }
    else if ((uVar22 & 0x6000) == 0) {
      if (bVar5 != 0x2f) goto code_r0x001ac907;
      if (((uVar22 & 0x88) == 0) && (local_c0->type != json_object)) {
        uVar19 = local_138._88_8_ & 0xffffffff;
        uVar21 = (ulong)local_138.cur_col;
        pcVar13 = "%d:%d: Comment not allowed here";
        goto LAB_001ad7e7;
      }
      local_138.ptr = (char *)((byte *)json + 1);
      if ((byte *)local_138.ptr == pbVar20) {
        uVar19 = local_138._88_8_ & 0xffffffff;
        uVar21 = (ulong)local_138.cur_col;
        pcVar13 = "%d:%d: EOF unexpected";
        goto LAB_001ad7e7;
      }
      if (*local_138.ptr == 0x2a) {
        uVar22 = uVar22 | 0x4000;
      }
      else {
        if (*local_138.ptr != 0x2f) {
          uVar19 = local_138._88_8_ & 0xffffffff;
          uVar21 = (ulong)local_138.cur_col;
          pcVar13 = "%d:%d: Unexpected `%c` in comment opening sequence";
          goto LAB_001ad7e7;
        }
        uVar22 = uVar22 | 0x2000;
      }
    }
    else if ((uVar22 >> 0xd & 1) == 0) {
      if ((uVar22 >> 0xe & 1) == 0) goto code_r0x001ac907;
      if (bVar5 == 0x2a) {
        if ((json < pbVar20 + -1) && (((byte *)json)[1] == 0x2f)) {
          local_138.ptr = (char *)((byte *)json + 1);
          uVar22 = uVar22 & 0xffff9fff;
        }
      }
      else if (uVar14 == 0) {
        uVar19 = local_138._88_8_ & 0xffffffff;
        uVar21 = (ulong)local_138.cur_col;
        pcVar13 = "%d:%d: Unexpected EOF in block comment";
        goto LAB_001ad7e7;
      }
    }
    else if ((bVar5 < 0xe) && ((0x2401U >> (uVar14 & 0x1f) & 1) != 0)) {
      uVar22 = uVar22 & 0xffffdfff;
      local_138.ptr = (char *)((byte *)json + -1);
    }
  }
  else {
    bVar5 = *json;
    uVar14 = (uint)bVar5;
    if ((uVar22 & 0x20) == 0) goto LAB_001ac8f0;
    if (bVar5 == 0) goto LAB_001ad7b7;
    if (local_138.uint_max < uVar16) {
LAB_001ad7d0:
      uVar19 = local_138._88_8_ & 0xffffffff;
      uVar21 = (ulong)local_138._88_8_ >> 0x20;
      pcVar13 = "%d:%d: Too long (caught overflow)";
      goto LAB_001ad7e7;
    }
    if ((uVar22 & 0x10) == 0) {
      if (bVar5 == 0x22) {
        if (local_138.first_pass == 0) {
          *(undefined1 *)((long)&local_188->parent + uVar21) = 0;
        }
        uVar22 = uVar22 & 0xffffffcf;
        if (local_c0->type != json_object) {
          uVar14 = 0x22;
          if (local_c0->type == json_string) {
            (local_c0->u).string.length = uVar16;
            bVar3 = true;
          }
          local_188 = (_json_value *)0x0;
          goto LAB_001ac8f0;
        }
        if (local_138.first_pass == 0) {
          *(anon_union_8_2_291a86ad_for__reserved *)
           ((local_c0->u).string.ptr + (ulong)(local_c0->u).string.length * 0x18) =
               local_c0->_reserved;
          paVar11 = &local_c0->_reserved;
          (local_c0->u).object.values[(local_c0->u).string.length].name_length = uVar16;
        }
        else {
          paVar11 = (anon_union_8_2_291a86ad_for__reserved *)&(local_c0->u).object.values;
        }
        paVar11->next_alloc =
             (_json_value *)((long)&paVar11->next_alloc->parent + (ulong)(uVar16 + 1));
        uVar22 = uVar22 | 0x48;
        local_188 = (_json_value *)0x0;
      }
      else {
        if (bVar5 != 0x5c) goto switchD_001aca12_caseD_6f;
        uVar22 = uVar22 | 0x10;
      }
      goto LAB_001ad068;
    }
    uVar22 = uVar22 & 0xffffffef;
    switch(bVar5) {
    case 0x6e:
      if (local_138.first_pass == 0) {
        *(undefined1 *)((long)&local_188->parent + uVar21) = 10;
      }
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
switchD_001aca12_caseD_6f:
      if (local_138.first_pass == 0) {
        *(byte *)((long)&local_188->parent + uVar21) = bVar5;
      }
      break;
    case 0x72:
      if (local_138.first_pass == 0) {
        *(undefined1 *)((long)&local_188->parent + uVar21) = 0xd;
      }
      break;
    case 0x74:
      if (local_138.first_pass == 0) {
        *(undefined1 *)((long)&local_188->parent + uVar21) = 9;
      }
      break;
    case 0x75:
      if (4 < (long)pbVar20 - (long)json) {
        local_138.ptr = (char *)((byte *)json + 1);
        uVar4 = hex_value(((byte *)json)[1]);
        if (uVar4 != 0xff) {
          local_138.ptr = (char *)((byte *)json + 2);
          bVar5 = hex_value(((byte *)json)[2]);
          if (bVar5 != 0xff) {
            local_138.ptr = (char *)((byte *)json + 3);
            uVar6 = hex_value(((byte *)json)[3]);
            if (uVar6 != 0xff) {
              local_138.ptr = (char *)((byte *)json + 4);
              bVar7 = hex_value(((byte *)json)[4]);
              if (bVar7 != 0xff) {
                bVar23 = uVar4 << 4 | bVar5;
                bVar7 = bVar7 | uVar6 << 4;
                uVar2 = CONCAT11(bVar23,bVar7);
                if ((byte)(uVar4 << 4 | bVar5 & 0xf8) != 0xd8) {
                  if (uVar2 < 0x80) {
                    if (local_138.first_pass == 0) {
                      *(byte *)((long)&local_188->parent + uVar21) = bVar7;
                    }
                    break;
                  }
                  if (bVar23 < 8) {
                    if (local_138.first_pass == 0) {
                      *(byte *)((long)&local_188->parent + uVar21) = (byte)(uVar2 >> 6) | 0xc0;
                      uVar21 = (ulong)(uVar16 + 2);
                      *(byte *)((long)&local_188->parent + (ulong)(uVar16 + 1)) =
                           bVar7 & 0x3f | 0x80;
                    }
                    else {
                      uVar21 = (ulong)(uVar16 + 2);
                    }
                  }
                  else if (local_138.first_pass == 0) {
                    *(byte *)((long)&local_188->parent + uVar21) = bVar23 >> 4 | 0xe0;
                    *(byte *)((long)&local_188->parent + (ulong)(uVar16 + 1)) =
                         (byte)(uVar2 >> 6) & 0x3f | 0x80;
                    uVar21 = (ulong)(uVar16 + 3);
                    *(byte *)((long)&local_188->parent + (ulong)(uVar16 + 2)) = bVar7 & 0x3f | 0x80;
                  }
                  else {
                    uVar21 = (ulong)(uVar16 + 3);
                  }
                  goto LAB_001ad068;
                }
                if (((6 < (long)pbVar20 - (long)((byte *)json + 4)) &&
                    (local_138.ptr = (char *)((byte *)json + 5), ((byte *)json)[5] == 0x5c)) &&
                   (local_138.ptr = (char *)((byte *)json + 6), ((byte *)json)[6] == 0x75)) {
                  local_138.ptr = (char *)((byte *)json + 7);
                  uVar4 = hex_value(((byte *)json)[7]);
                  if (uVar4 != 0xff) {
                    local_138.ptr = (char *)((byte *)json + 8);
                    bVar23 = hex_value(((byte *)json)[8]);
                    if (bVar23 != 0xff) {
                      local_138.ptr = (char *)((byte *)json + 9);
                      uVar4 = hex_value(((byte *)json)[9]);
                      if (uVar4 != 0xff) {
                        local_138.ptr = (char *)((byte *)json + 10);
                        bVar8 = hex_value(((byte *)json)[10]);
                        if (bVar8 != 0xff) {
                          if (local_138.first_pass == 0) {
                            bVar8 = bVar8 | uVar4 << 4;
                            *(byte *)((long)&local_188->parent + uVar21) = bVar5 & 3 | 0xf0;
                            *(byte *)((long)&local_188->parent + (ulong)(uVar16 + 1)) =
                                 bVar7 >> 2 | 0x90;
                            *(byte *)((long)&local_188->parent + (ulong)(uVar16 + 2)) =
                                 (byte)(((bVar23 & 3) << 8 | (uint)bVar8 | (uint)uVar2 << 10) >> 6)
                                 & 0x3f | 0x80;
                            *(byte *)((long)&local_188->parent + (ulong)(uVar16 + 3)) =
                                 bVar8 & 0x3f | 0x80;
                          }
                          uVar21 = (ulong)(uVar16 + 4);
                          goto LAB_001ad068;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      __sprintf_chk(&local_b8,1,0x80,"Invalid character value `%c` (at %d:%d)",0x75,
                    local_138._88_8_ & 0xffffffff,local_138.cur_col);
      goto LAB_001ad800;
    default:
      if (bVar5 == 0x66) {
        if (local_138.first_pass == 0) {
          *(undefined1 *)((long)&local_188->parent + uVar21) = 0xc;
        }
      }
      else {
        if (bVar5 != 0x62) goto switchD_001aca12_caseD_6f;
        if (local_138.first_pass == 0) {
          *(undefined1 *)((long)&local_188->parent + uVar21) = 8;
        }
      }
    }
    uVar21 = (ulong)(uVar16 + 1);
  }
LAB_001ad068:
  json = local_138.ptr + 1;
  goto LAB_001ac893;
}

Assistant:

json_value * json_parse_ex (json_settings * settings,
                            const json_char * json,
                            size_t length,
                            char * error_buf)
{
   json_char error [json_error_max];
   const json_char * end;
   json_value * top, * root, * alloc = 0;
   json_state state = { 0 };
   long flags;
   long num_digits = 0, num_e = 0;
   json_int_t num_fraction = 0;

   /* Skip UTF-8 BOM
    */
   if (length >= 3 && ((unsigned char) json [0]) == 0xEF
                   && ((unsigned char) json [1]) == 0xBB
                   && ((unsigned char) json [2]) == 0xBF)
   {
      json += 3;
      length -= 3;
   }

   error[0] = '\0';
   end = (json + length);

   memcpy (&state.settings, settings, sizeof (json_settings));

   if (!state.settings.mem_alloc)
      state.settings.mem_alloc = default_alloc;

   if (!state.settings.mem_free)
      state.settings.mem_free = default_free;

   memset (&state.uint_max, 0xFF, sizeof (state.uint_max));
   memset (&state.ulong_max, 0xFF, sizeof (state.ulong_max));

   state.uint_max -= 8; /* limit of how much can be added before next check */
   state.ulong_max -= 8;

   for (state.first_pass = 1; state.first_pass >= 0; -- state.first_pass)
   {
      json_uchar uchar;
      unsigned char uc_b1, uc_b2, uc_b3, uc_b4;
      json_char * string = 0;
      unsigned int string_length = 0;

      top = root = 0;
      flags = flag_seek_value;

      state.cur_line = 1;

      for (state.ptr = json ;; ++ state.ptr)
      {
         json_char b = (state.ptr == end ? 0 : *state.ptr);
         
         if (flags & flag_string)
         {
            if (!b)
            {  sprintf (error, "Unexpected EOF in string (at %d:%d)", line_and_col);
               goto e_failed;
            }

            if (string_length > state.uint_max)
               goto e_overflow;

            if (flags & flag_escaped)
            {
               flags &= ~ flag_escaped;

               switch (b)
               {
                  case 'b':  string_add ('\b');  break;
                  case 'f':  string_add ('\f');  break;
                  case 'n':  string_add ('\n');  break;
                  case 'r':  string_add ('\r');  break;
                  case 't':  string_add ('\t');  break;
                  case 'u':

                    if (end - state.ptr <= 4 || 
                        (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                    {
                        sprintf (error, "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                        goto e_failed;
                    }

                    uc_b1 = (uc_b1 << 4) | uc_b2;
                    uc_b2 = (uc_b3 << 4) | uc_b4;
                    uchar = (uc_b1 << 8) | uc_b2;

                    if ((uchar & 0xF800) == 0xD800) {
                        json_uchar uchar2;
                        
                        if (end - state.ptr <= 6 || (*++ state.ptr) != '\\' || (*++ state.ptr) != 'u' ||
                            (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                        {
                            sprintf (error, "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                            goto e_failed;
                        }

                        uc_b1 = (uc_b1 << 4) | uc_b2;
                        uc_b2 = (uc_b3 << 4) | uc_b4;
                        uchar2 = (uc_b1 << 8) | uc_b2;
                        
                        uchar = 0x010000 | ((uchar & 0x3FF) << 10) | (uchar2 & 0x3FF);
                    }

                    if (sizeof (json_char) >= sizeof (json_uchar) || (uchar <= 0x7F))
                    {
                       string_add ((json_char) uchar);
                       break;
                    }

                    if (uchar <= 0x7FF)
                    {
                        if (state.first_pass)
                           string_length += 2;
                        else
                        {  string [string_length ++] = 0xC0 | (uchar >> 6);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (uchar <= 0xFFFF) {
                        if (state.first_pass)
                           string_length += 3;
                        else
                        {  string [string_length ++] = 0xE0 | (uchar >> 12);
                           string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }
                        
                        break;
                    }

                    if (state.first_pass)
                       string_length += 4;
                    else
                    {  string [string_length ++] = 0xF0 | (uchar >> 18);
                       string [string_length ++] = 0x80 | ((uchar >> 12) & 0x3F);
                       string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                       string [string_length ++] = 0x80 | (uchar & 0x3F);
                    }

                    break;

                  default:
                     string_add (b);
               };

               continue;
            }

            if (b == '\\')
            {
               flags |= flag_escaped;
               continue;
            }

            if (b == '"')
            {
               if (!state.first_pass)
                  string [string_length] = 0;

               flags &= ~ flag_string;
               string = 0;

               switch (top->type)
               {
                  case json_string:

                     top->u.string.length = string_length;
                     flags |= flag_next;

                     break;

                  case json_object:

                     if (state.first_pass)
                        (*(json_char **) &top->u.object.values) += string_length + 1;
                     else
                     {  
                        top->u.object.values [top->u.object.length].name
                           = (json_char *) top->_reserved.object_mem;

                        top->u.object.values [top->u.object.length].name_length
                           = string_length;

                        (*(json_char **) &top->_reserved.object_mem) += string_length + 1;
                     }

                     flags |= flag_seek_value | flag_need_colon;
                     continue;

                  default:
                     break;
               };
            }
            else
            {
               string_add (b);
               continue;
            }
         }

         if (state.settings.settings & json_enable_comments)
         {
            if (flags & (flag_line_comment | flag_block_comment))
            {
               if (flags & flag_line_comment)
               {
                  if (b == '\r' || b == '\n' || !b)
                  {
                     flags &= ~ flag_line_comment;
                     -- state.ptr;  /* so null can be reproc'd */
                  }

                  continue;
               }

               if (flags & flag_block_comment)
               {
                  if (!b)
                  {  sprintf (error, "%d:%d: Unexpected EOF in block comment", line_and_col);
                     goto e_failed;
                  }

                  if (b == '*' && state.ptr < (end - 1) && state.ptr [1] == '/')
                  {
                     flags &= ~ flag_block_comment;
                     ++ state.ptr;  /* skip closing sequence */
                  }

                  continue;
               }
            }
            else if (b == '/')
            {
               if (! (flags & (flag_seek_value | flag_done)) && top->type != json_object)
               {  sprintf (error, "%d:%d: Comment not allowed here", line_and_col);
                  goto e_failed;
               }

               if (++ state.ptr == end)
               {  sprintf (error, "%d:%d: EOF unexpected", line_and_col);
                  goto e_failed;
               }

               switch (b = *state.ptr)
               {
                  case '/':
                     flags |= flag_line_comment;
                     continue;

                  case '*':
                     flags |= flag_block_comment;
                     continue;

                  default:
                     sprintf (error, "%d:%d: Unexpected `%c` in comment opening sequence", line_and_col, b);
                     goto e_failed;
               };
            }
         }

         if (flags & flag_done)
         {
            if (!b)
               break;

            switch (b)
            {
               whitespace:
                  continue;

               default:

                  sprintf (error, "%d:%d: Trailing garbage: `%c`",
                           state.cur_line, state.cur_col, b);

                  goto e_failed;
            };
         }

         if (flags & flag_seek_value)
         {
            switch (b)
            {
               whitespace:
                  continue;

               case ']':

                  if (top && top->type == json_array)
                     flags = (flags & ~ (flag_need_comma | flag_seek_value)) | flag_next;
                  else
                  {  sprintf (error, "%d:%d: Unexpected ]", line_and_col);
                     goto e_failed;
                  }

                  break;

               default:

                  if (flags & flag_need_comma)
                  {
                     if (b == ',')
                     {  flags &= ~ flag_need_comma;
                        continue;
                     }
                     else
                     {
                        sprintf (error, "%d:%d: Expected , before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  if (flags & flag_need_colon)
                  {
                     if (b == ':')
                     {  flags &= ~ flag_need_colon;
                        continue;
                     }
                     else
                     { 
                        sprintf (error, "%d:%d: Expected : before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  flags &= ~ flag_seek_value;

                  switch (b)
                  {
                     case '{':

                        if (!new_value (&state, &top, &root, &alloc, json_object))
                           goto e_alloc_failure;

                        continue;

                     case '[':

                        if (!new_value (&state, &top, &root, &alloc, json_array))
                           goto e_alloc_failure;

                        flags |= flag_seek_value;
                        continue;

                     case '"':

                        if (!new_value (&state, &top, &root, &alloc, json_string))
                           goto e_alloc_failure;

                        flags |= flag_string;

                        string = top->u.string.ptr;
                        string_length = 0;

                        continue;

                     case 't':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'r' ||
                            *(++ state.ptr) != 'u' || *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        top->u.boolean = 1;

                        flags |= flag_next;
                        break;

                     case 'f':

                        if ((end - state.ptr) < 4 || *(++ state.ptr) != 'a' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 's' ||
                            *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     case 'n':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'u' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 'l')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_null))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     default:

                        if (isdigit (b) || b == '-')
                        {
                           if (!new_value (&state, &top, &root, &alloc, json_integer))
                              goto e_alloc_failure;

                           if (!state.first_pass)
                           {
                              while (isdigit (b) || b == '+' || b == '-'
                                        || b == 'e' || b == 'E' || b == '.')
                              {
                                 if ( (++ state.ptr) == end)
                                 {
                                    b = 0;
                                    break;
                                 }

                                 b = *state.ptr;
                              }

                              flags |= flag_next | flag_reproc;
                              break;
                           }

                           flags &= ~ (flag_num_negative | flag_num_e |
                                        flag_num_e_got_sign | flag_num_e_negative |
                                           flag_num_zero);

                           num_digits = 0;
                           num_fraction = 0;
                           num_e = 0;

                           if (b != '-')
                           {
                              flags |= flag_reproc;
                              break;
                           }

                           flags |= flag_num_negative;
                           continue;
                        }
                        else
                        {  sprintf (error, "%d:%d: Unexpected %c when seeking value", line_and_col, b);
                           goto e_failed;
                        }
                  };
            };
         }
         else
         {
            switch (top->type)
            {
            case json_object:
               
               switch (b)
               {
                  whitespace:
                     continue;

                  case '"':

                     if (flags & flag_need_comma)
                     {  sprintf (error, "%d:%d: Expected , before \"", line_and_col);
                        goto e_failed;
                     }

                     flags |= flag_string;

                     string = (json_char *) top->_reserved.object_mem;
                     string_length = 0;

                     break;
                  
                  case '}':

                     flags = (flags & ~ flag_need_comma) | flag_next;
                     break;

                  case ',':

                     if (flags & flag_need_comma)
                     {
                        flags &= ~ flag_need_comma;
                        break;
                     }

                  default:
                     sprintf (error, "%d:%d: Unexpected `%c` in object", line_and_col, b);
                     goto e_failed;
               };

               break;

            case json_integer:
            case json_double:

               if (isdigit (b))
               {
                  ++ num_digits;

                  if (top->type == json_integer || flags & flag_num_e)
                  {
                     if (! (flags & flag_num_e))
                     {
                        if (flags & flag_num_zero)
                        {  sprintf (error, "%d:%d: Unexpected `0` before `%c`", line_and_col, b);
                           goto e_failed;
                        }

                        if (num_digits == 1 && b == '0')
                           flags |= flag_num_zero;
                     }
                     else
                     {
                        flags |= flag_num_e_got_sign;
                        num_e = (num_e * 10) + (b - '0');
                        continue;
                     }

                     top->u.integer = (top->u.integer * 10) + (b - '0');
                     continue;
                  }

                  num_fraction = (num_fraction * 10) + (b - '0');
                  continue;
               }

               if (b == '+' || b == '-')
               {
                  if ( (flags & flag_num_e) && !(flags & flag_num_e_got_sign))
                  {
                     flags |= flag_num_e_got_sign;

                     if (b == '-')
                        flags |= flag_num_e_negative;

                     continue;
                  }
               }
               else if (b == '.' && top->type == json_integer)
               {
                  if (!num_digits)
                  {  sprintf (error, "%d:%d: Expected digit before `.`", line_and_col);
                     goto e_failed;
                  }

                  top->type = json_double;
                  top->u.dbl = (double) top->u.integer;

                  num_digits = 0;
                  continue;
               }

               if (! (flags & flag_num_e))
               {
                  if (top->type == json_double)
                  {
                     if (!num_digits)
                     {  sprintf (error, "%d:%d: Expected digit after `.`", line_and_col);
                        goto e_failed;
                     }

                     top->u.dbl += ((double) num_fraction) / (pow (10.0, (double) num_digits));
                  }

                  if (b == 'e' || b == 'E')
                  {
                     flags |= flag_num_e;

                     if (top->type == json_integer)
                     {
                        top->type = json_double;
                        top->u.dbl = (double) top->u.integer;
                     }

                     num_digits = 0;
                     flags &= ~ flag_num_zero;

                     continue;
                  }
               }
               else
               {
                  if (!num_digits)
                  {  sprintf (error, "%d:%d: Expected digit after `e`", line_and_col);
                     goto e_failed;
                  }

                  top->u.dbl *= pow (10.0, (double)
                      (flags & flag_num_e_negative ? - num_e : num_e));
               }

               if (flags & flag_num_negative)
               {
                  if (top->type == json_integer)
                     top->u.integer = - top->u.integer;
                  else
                     top->u.dbl = - top->u.dbl;
               }

               flags |= flag_next | flag_reproc;
               break;

            default:
               break;
            };
         }

         if (flags & flag_reproc)
         {
            flags &= ~ flag_reproc;
            -- state.ptr;
         }

         if (flags & flag_next)
         {
            flags = (flags & ~ flag_next) | flag_need_comma;

            if (!top->parent)
            {
               /* root value done */

               flags |= flag_done;
               continue;
            }

            if (top->parent->type == json_array)
               flags |= flag_seek_value;
               
            if (!state.first_pass)
            {
               json_value * parent = top->parent;

               switch (parent->type)
               {
                  case json_object:

                     parent->u.object.values
                        [parent->u.object.length].value = top;

                     break;

                  case json_array:

                     parent->u.array.values
                           [parent->u.array.length] = top;

                     break;

                  default:
                     break;
               };
            }

            if ( (++ top->parent->u.array.length) > state.uint_max)
               goto e_overflow;

            top = top->parent;

            continue;
         }
      }

      alloc = root;
   }

   return root;

e_unknown_value:

   sprintf (error, "%d:%d: Unknown value", line_and_col);
   goto e_failed;

e_alloc_failure:

   strcpy (error, "Memory allocation failure");
   goto e_failed;

e_overflow:

   sprintf (error, "%d:%d: Too long (caught overflow)", line_and_col);
   goto e_failed;

e_failed:

   if (error_buf)
   {
      if (*error)
         strcpy (error_buf, error);
      else
         strcpy (error_buf, "Unknown error");
   }

   if (state.first_pass)
      alloc = root;

   while (alloc)
   {
      top = alloc->_reserved.next_alloc;
      state.settings.mem_free (alloc, state.settings.user_data);
      alloc = top;
   }

   if (!state.first_pass)
      json_value_free_ex (&state.settings, root);

   return 0;
}